

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O3

void __thiscall
Lib::DArray<Kernel::Literal*>::
sortGen<true,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
          (DArray<Kernel::Literal*> *this,
          Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
          *comp)

{
  uint uVar1;
  Literal *l1;
  undefined8 uVar2;
  unsigned_long uVar3;
  result_type_conflict1 rVar4;
  Comparison CVar5;
  int iVar6;
  Literal *aux;
  long lVar7;
  unsigned_long *puVar8;
  Literal *pLVar9;
  unsigned_long uVar10;
  ulong uVar11;
  unsigned_long *res;
  unsigned_long s;
  long local_50;
  uniform_int_distribution<int> local_48;
  unsigned_long local_40;
  unsigned_long local_38;
  
  if (1 < *(ulong *)this) {
    if ((sortGen<true,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>(Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>)
         ::ft == '\0') &&
       (iVar6 = __cxa_guard_acquire(&sortGen<true,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>(Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>)
                                     ::ft), iVar6 != 0)) {
      DArray<Kernel::Literal_*>::
      sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
      ::ft._size = 0x20;
      DArray<Kernel::Literal_*>::
      sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
      ::ft._capacity = 0x20;
      puVar8 = (unsigned_long *)::operator_new(0x100,0x10);
      if (DArray<Kernel::Literal_*>::
          sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
          ::ft._capacity != 0) {
        memset(puVar8,0,DArray<Kernel::Literal_*>::
                        sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                        ::ft._capacity << 3);
      }
      DArray<Kernel::Literal_*>::
      sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
      ::ft._array = puVar8;
      __cxa_atexit(DArray<unsigned_long>::~DArray,
                   &DArray<Kernel::Literal_*>::
                    sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                    ::ft,&__dso_handle);
      __cxa_guard_release(&sortGen<true,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>(Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>)
                           ::ft);
    }
    s = *(long *)this - 1;
    DArray<unsigned_long>::ensure
              (&DArray<Kernel::Literal_*>::
                sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                ::ft,s);
    local_50 = 0;
    uVar10 = 0;
    local_40 = uVar10;
LAB_0054cdd7:
    do {
      local_48._M_param._M_b = (int)s - (int)uVar10;
      local_48._M_param._M_a = 0;
      rVar4 = std::uniform_int_distribution<int>::operator()
                        (&local_48,&Random::_eng,&local_48._M_param);
      uVar11 = (long)rVar4 + uVar10;
      l1 = *(Literal **)(*(long *)(this + 0x10) + uVar11 * 8);
      local_38 = s;
      while (uVar3 = local_40, uVar10 < uVar11) {
        pLVar9 = *(Literal **)(*(long *)(this + 0x10) + uVar10 * 8);
        uVar1 = *(uint *)&(l1->super_Term).field_0xc;
        if (((pLVar9->super_Term).field_0xf & 0x30) == 0) {
          if ((uVar1 & 0x30000000) == 0) goto LAB_0054ce3a;
          goto LAB_0054ce54;
        }
        if ((uVar1 & 0x30000000) == 0) {
LAB_0054ce4a:
          uVar10 = uVar10 + 1;
        }
        else {
LAB_0054ce3a:
          CVar5 = Kernel::LiteralComparators::
                  Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>
                  ::compare(&comp->_c2,pLVar9,l1);
          if ((uint)CVar5 < 2) goto LAB_0054ce4a;
          if (CVar5 == LESS) {
LAB_0054ce54:
            lVar7 = *(long *)(this + 0x10);
            uVar2 = *(undefined8 *)(lVar7 + uVar10 * 8);
            if (uVar11 == s) {
              *(undefined8 *)(lVar7 + s * 8) = uVar2;
              uVar11 = s - 1;
              *(undefined8 *)(*(long *)(this + 0x10) + uVar10 * 8) =
                   *(undefined8 *)(*(long *)(this + 0x10) + -8 + s * 8);
              *(Literal **)(*(long *)(this + 0x10) + -8 + s * 8) = l1;
              s = uVar11;
            }
            else {
              *(undefined8 *)(lVar7 + uVar10 * 8) = *(undefined8 *)(lVar7 + s * 8);
              *(undefined8 *)(*(long *)(this + 0x10) + s * 8) = uVar2;
              s = s - 1;
            }
          }
        }
      }
      if (uVar11 < s) {
        do {
          lVar7 = *(long *)(this + 0x10);
          pLVar9 = *(Literal **)(lVar7 + 8 + uVar11 * 8);
          uVar1 = *(uint *)&(pLVar9->super_Term).field_0xc;
          if (((l1->super_Term).field_0xf & 0x30) == 0) {
            if ((uVar1 & 0x30000000) == 0) goto LAB_0054ceca;
LAB_0054cedd:
            *(undefined8 *)(*(long *)(this + 0x10) + uVar11 * 8) =
                 *(undefined8 *)(*(long *)(this + 0x10) + 8 + uVar11 * 8);
            *(Literal **)(*(long *)(this + 0x10) + 8 + uVar11 * 8) = l1;
            uVar11 = uVar11 + 1;
          }
          else if ((uVar1 & 0x30000000) == 0) {
LAB_0054cf06:
            uVar2 = *(undefined8 *)(lVar7 + s * 8);
            *(Literal **)(lVar7 + s * 8) = pLVar9;
            *(undefined8 *)(*(long *)(this + 0x10) + 8 + uVar11 * 8) = uVar2;
            s = s - 1;
          }
          else {
LAB_0054ceca:
            CVar5 = Kernel::LiteralComparators::
                    Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>
                    ::compare(&comp->_c2,l1,pLVar9);
            if ((uint)(CVar5 + GREATER) < 2) goto LAB_0054cedd;
            if (CVar5 == GREATER) {
              lVar7 = *(long *)(this + 0x10);
              pLVar9 = *(Literal **)(lVar7 + 8 + uVar11 * 8);
              goto LAB_0054cf06;
            }
          }
        } while (uVar11 < s);
      }
      puVar8 = DArray<Kernel::Literal_*>::
               sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
               ::ft._array;
      if (uVar11 + 1 < local_38) {
        DArray<Kernel::Literal_*>::
        sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
        ::ft._array[local_50] = uVar11 + 1;
        puVar8[local_50 + 1] = local_38;
        local_50 = local_50 + 2;
      }
      s = uVar11 - 1;
    } while ((uVar11 != 0) && (uVar10 = uVar3, uVar3 < s));
    if (local_50 != 0) {
      uVar10 = DArray<Kernel::Literal_*>::
               sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
               ::ft._array[local_50 + -2];
      s = DArray<Kernel::Literal_*>::
          sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
          ::ft._array[local_50 + -1];
      local_50 = local_50 + -2;
      local_40 = uVar10;
      goto LAB_0054cdd7;
    }
  }
  return;
}

Assistant:

void sortGen(Comparator comp)
  {
    if(_size <= 1) {
      return;
    }

    // array behaves as a stack of calls to quicksort
    static DArray<size_t> ft(32);

    size_t from = 0;
    size_t to=size()-1;
    ft.ensure(to);

    size_t p = 0; // pointer to the next element in ft
    for (;;) {
      ASS(from<size() && to<size()); //checking for underflows
      ASS(from<to);
      // invariant: from < to
      size_t m = from + Random::getInteger(to-from+1);
      C mid = (*this)[m];
      size_t l = from;
      size_t r = to;
      while (l < m) {
        switch ((Inversed?-1:1)*comp.compare((*this)[l],mid))
  	{
  	case EQUAL:
  	case LESS:
  	  l++;
  	  break;
  	case GREATER:
  	  if (m == r) {
  	    (*this)[m] = (*this)[l];
  	    (*this)[l] = (*this)[m-1];
  	    (*this)[m-1] = mid;
  	    m--;
  	    r--;
  	  }
  	  else {
  	    ASS(m < r);
  	    C aux = (*this)[l];
  	    (*this)[l] = (*this)[r];
  	    (*this)[r] = aux;
  	    r--;
  	  }
  	  break;
  	}
      }
      // l == m
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and literals in lits[r+1 ... to] are greater than lits[m]
      while (m < r) {
        switch ((Inversed?-1:1)*comp.compare(mid,(*this)[m+1]))
  	{
  	case LESS:
  	  {
  	    C aux = (*this)[r];
  	    (*this)[r] = (*this)[m+1];
  	    (*this)[m+1] = aux;
  	    r--;
  	  }
  	  break;
  	case EQUAL:
  	case GREATER:
  	  (*this)[m] = (*this)[m+1];
  	  (*this)[m+1] = mid;
  	  m++;
  	}
      }
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and all literals in lits[m+1 ... to] are greater than lits[m]
      if (m+1 < to) {
        ft[p++] = m+1;
        ft[p++] = to;
      }

      to = m-1;
      if (m!=0 && from < to) {
        continue;
      }
      if (p != 0) {
        p -= 2;
        ASS(p >= 0);
        from = ft[p];
        to = ft[p+1];
        continue;
      }
      return;
    }
  }